

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O1

double mpack_node_double(mpack_node_t node)

{
  mpack_tree_t *pmVar1;
  mpack_node_data_t *pmVar2;
  
  pmVar1 = node.tree;
  pmVar2 = node.data;
  if (pmVar1->error == mpack_ok) {
    switch(pmVar2->type) {
    case mpack_type_int:
      return (double)(pmVar2->value).i;
    case mpack_type_uint:
      return ((double)CONCAT44(0x45300000,(int)((ulong)pmVar2->value >> 0x20)) -
             1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(pmVar2->value).f) - 4503599627370496.0);
    case mpack_type_float:
      return (double)(pmVar2->value).f;
    case mpack_type_double:
      return (pmVar2->value).d;
    }
    pmVar1->error = mpack_error_type;
    if (pmVar1->error_fn != (mpack_tree_error_t)0x0) {
      (*pmVar1->error_fn)(pmVar1,mpack_error_type);
      return 0.0;
    }
  }
  return 0.0;
}

Assistant:

MPACK_INLINE double mpack_node_double(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0.0;

    if (node.data->type == mpack_type_uint)
        return (double)node.data->value.u;
    else if (node.data->type == mpack_type_int)
        return (double)node.data->value.i;
    else if (node.data->type == mpack_type_float)
        return (double)node.data->value.f;
    else if (node.data->type == mpack_type_double)
        return node.data->value.d;

    mpack_node_flag_error(node, mpack_error_type);
    return 0.0;
}